

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

void __thiscall
tcu::astc::anon_unknown_0::BitAssignAccessStream::setNext
          (BitAssignAccessStream *this,int num,deUint32 bits)

{
  int iVar1;
  deUint32 bits_00;
  int numBits;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  if (num != 0) {
    iVar7 = this->m_length;
    iVar1 = this->m_ndx;
    if (iVar1 < iVar7) {
      iVar6 = num + iVar1;
      if (iVar6 <= iVar7) {
        iVar7 = iVar6;
      }
      uVar3 = iVar7 - iVar1;
      uVar2 = 0;
      if (0 < (int)uVar3) {
        uVar2 = uVar3;
      }
      iVar7 = iVar1 + uVar2 + -1;
      uVar5 = ~(-1 << ((byte)uVar2 & 0x1f));
      if (0x1f < (int)uVar3) {
        uVar5 = 0xffffffff;
      }
      this->m_ndx = iVar6;
      bits_00 = uVar5 & bits;
      if (this->m_forward != true) {
        iVar6 = -iVar7;
        iVar7 = -iVar1;
        bits_00 = 0;
        iVar1 = iVar6;
        if (0 < (int)uVar3) {
          uVar4 = 0;
          bits_00 = 0;
          do {
            uVar2 = uVar2 - 1;
            bits_00 = bits_00 | (uint)(((uVar5 & bits) >> (uVar4 & 0x1f) & 1) != 0) <<
                                ((byte)uVar2 & 0x1f);
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
      }
      AssignBlock128::setBits
                (this->m_dst,iVar1 + this->m_startNdxInSrc,iVar7 + this->m_startNdxInSrc,bits_00);
      return;
    }
  }
  return;
}

Assistant:

void setNext (int num, deUint32 bits)
	{
		DE_ASSERT((bits & (((deUint64)1 << num) - 1)) == bits);

		if (num == 0 || m_ndx >= m_length)
			return;

		const int		end				= m_ndx + num;
		const int		numBitsToDst	= de::max(0, de::min(m_length, end) - m_ndx);
		const int		low				= m_ndx;
		const int		high			= m_ndx + numBitsToDst - 1;
		const deUint32	actualBits		= getBits(bits, 0, numBitsToDst-1);

		m_ndx += num;

		return m_forward ? m_dst.setBits(m_startNdxInSrc + low,  m_startNdxInSrc + high, actualBits)
						 : m_dst.setBits(m_startNdxInSrc - high, m_startNdxInSrc - low, reverseBits(actualBits, numBitsToDst));
	}